

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Dot_Access_AST_Node::eval_internal(Dot_Access_AST_Node *this,Dispatch_State *t_ss)

{
  initializer_list<chaiscript::Boxed_Value> __l;
  initializer_list<chaiscript::Boxed_Value> __l_00;
  ulong uVar1;
  undefined1 *puVar2;
  bool bVar3;
  element_type *peVar4;
  size_type sVar5;
  Type_Conversions_State *pTVar6;
  Dispatch_Engine *this_00;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar7;
  Type_Conversions_State *in_stack_00000010;
  dispatch_error *e_1;
  dispatch_error *e;
  Return_Value *rv;
  shared_ptr<chaiscript::AST_Node> *child;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *__range3;
  bool has_function_params;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> params;
  Function_Push_Pop fpp;
  Boxed_Value *retval;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffc68;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffc70;
  Dispatch_State *in_stack_fffffffffffffc78;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffc80;
  allocator_type *in_stack_fffffffffffffc98;
  Dispatch_State *in_stack_fffffffffffffca0;
  AST_Node *in_stack_fffffffffffffca8;
  size_type in_stack_fffffffffffffcb0;
  Type_Conversions_State *in_stack_fffffffffffffcc0;
  undefined8 **ppuVar8;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffcc8;
  undefined8 **ppuVar9;
  atomic_uint_fast32_t *in_stack_fffffffffffffcd0;
  string *t_name;
  undefined1 *local_288;
  undefined1 local_221 [9];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined8 *local_1f8;
  undefined8 local_1f0;
  allocator local_1c9;
  string local_1c8 [304];
  reference local_98;
  shared_ptr<chaiscript::AST_Node> *local_90;
  __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
  local_88;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *local_80;
  undefined1 local_72;
  undefined1 local_70 [16];
  undefined1 local_60 [7];
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params_00;
  atomic_uint_fast32_t *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  Dispatch_Engine *in_stack_ffffffffffffffc0;
  
  eval::detail::Function_Push_Pop::Function_Push_Pop
            ((Function_Push_Pop *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 0x60),0);
  std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x25422c);
  AST_Node::eval(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  Boxed_Value::Boxed_Value
            ((Boxed_Value *)in_stack_fffffffffffffc70,(Boxed_Value *)in_stack_fffffffffffffc68);
  params_00 = (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)0x1;
  _local_60 = local_70;
  std::allocator<chaiscript::Boxed_Value>::allocator((allocator<chaiscript::Boxed_Value> *)0x254294)
  ;
  __l._M_len = in_stack_fffffffffffffcb0;
  __l._M_array = (iterator)in_stack_fffffffffffffca8;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             in_stack_fffffffffffffca0,__l,in_stack_fffffffffffffc98);
  std::allocator<chaiscript::Boxed_Value>::~allocator
            ((allocator<chaiscript::Boxed_Value> *)0x2542c8);
  local_288 = local_60;
  do {
    local_288 = local_288 + -0x10;
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x2542fd);
  } while (local_288 != local_70);
  local_72 = 0;
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 0x60),2);
  peVar4 = std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x254340);
  sVar5 = std::
          vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          ::size(&peVar4->children);
  if (1 < sVar5) {
    local_72 = 1;
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),2);
    peVar4 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25437c);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[](&peVar4->children,1);
    peVar4 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x254395);
    local_80 = &peVar4->children;
    local_88._M_current =
         (shared_ptr<chaiscript::AST_Node> *)
         std::
         vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
         ::begin((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)in_stack_fffffffffffffc68);
    local_90 = (shared_ptr<chaiscript::AST_Node> *)
               std::
               vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
               ::end((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                      *)in_stack_fffffffffffffc68);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                               *)in_stack_fffffffffffffc70,
                              (__normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                               *)in_stack_fffffffffffffc68), bVar3) {
      local_98 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                 ::operator*(&local_88);
      std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x25440b);
      AST_Node::eval(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
                (in_stack_fffffffffffffc70,(value_type *)in_stack_fffffffffffffc68);
      Boxed_Value::~Boxed_Value((Boxed_Value *)0x254449);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
      ::operator++(&local_88);
    }
  }
  eval::detail::Function_Push_Pop::save_params
            ((Function_Push_Pop *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  chaiscript::detail::Dispatch_State::operator->((Dispatch_State *)0x254551);
  pTVar6 = chaiscript::detail::Dispatch_State::conversions(in_RDX);
  puVar2 = _local_60;
  uVar1 = (ulong)_local_60 >> 0x38;
  bVar3 = SUB81(uVar1,0);
  _local_60 = puVar2;
  chaiscript::detail::Dispatch_Engine::call_member
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,params_00
             ,bVar3,in_stack_00000010);
  Boxed_Value::operator=((Boxed_Value *)in_stack_fffffffffffffc70,(Boxed_Value *)pTVar6);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x254606);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 0x60),2);
  peVar4 = std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x254a09);
  if (peVar4->identifier == 0x12) {
    chaiscript::detail::Dispatch_State::operator->((Dispatch_State *)0x254a20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"[]",&local_1c9);
    this_00 = (Dispatch_Engine *)(in_RSI + 0x90);
    local_221._1_8_ = local_218;
    Boxed_Value::Boxed_Value((Boxed_Value *)in_stack_fffffffffffffc70,(Boxed_Value *)pTVar6);
    local_221._1_8_ = local_208;
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),2);
    peVar4 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x254ac1);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[](&peVar4->children,1);
    std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x254ada);
    AST_Node::eval(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    local_1f8 = local_218;
    local_1f0 = 2;
    t_name = (string *)local_221;
    std::allocator<chaiscript::Boxed_Value>::allocator
              ((allocator<chaiscript::Boxed_Value> *)0x254b22);
    __l_00._M_len = in_stack_fffffffffffffcb0;
    __l_00._M_array = (iterator)in_stack_fffffffffffffca8;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_fffffffffffffca0,__l_00,in_stack_fffffffffffffc98);
    chaiscript::detail::Dispatch_State::conversions(in_RDX);
    chaiscript::detail::Dispatch_Engine::call_function
              (this_00,t_name,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
               in_stack_fffffffffffffcc0);
    Boxed_Value::operator=((Boxed_Value *)in_stack_fffffffffffffc70,(Boxed_Value *)pTVar6);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x254ba4);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (in_stack_fffffffffffffc80);
    std::allocator<chaiscript::Boxed_Value>::~allocator
              ((allocator<chaiscript::Boxed_Value> *)0x254bbe);
    ppuVar9 = (undefined8 **)local_218;
    ppuVar8 = &local_1f8;
    do {
      ppuVar8 = ppuVar8 + -2;
      Boxed_Value::~Boxed_Value((Boxed_Value *)0x254be7);
    } while (ppuVar8 != ppuVar9);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  }
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            (in_stack_fffffffffffffc80);
  eval::detail::Function_Push_Pop::~Function_Push_Pop
            ((Function_Push_Pop *)in_stack_fffffffffffffc80);
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);


          Boxed_Value retval = children[0]->eval(t_ss);
          std::vector<Boxed_Value> params{retval};

          bool has_function_params = false;
          if (children[2]->children.size() > 1) {
            has_function_params = true;
            for (const auto &child : children[2]->children[1]->children) {
              params.push_back(child->eval(t_ss));
            }
          }

          fpp.save_params(params);

          try {
            retval = t_ss->call_member(m_fun_name, m_loc, std::move(params), has_function_params, t_ss.conversions());
          }
          catch(const exception::dispatch_error &e){
            if (e.functions.empty())
            {
              throw exception::eval_error("'" + m_fun_name + "' is not a function.");
            } else {
              throw exception::eval_error(std::string(e.what()) + " for function '" + m_fun_name + "'", e.parameters, e.functions, true, *t_ss);
            }
          }
          catch(detail::Return_Value &rv) {
            retval = std::move(rv.retval);
          }

          if (this->children[2]->identifier == AST_Node_Type::Array_Call) {
            try {
              retval = t_ss->call_function("[]", m_array_loc, {retval, this->children[2]->children[1]->eval(t_ss)}, t_ss.conversions());
            }
            catch(const exception::dispatch_error &e){
              throw exception::eval_error("Can not find appropriate array lookup operator '[]'.", e.parameters, e.functions, true, *t_ss);
            }
          }

          return retval;
        }